

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esfm.c
# Opt level: O0

void ESFM_phase_generate_emu(esfm_slot *slot)

{
  int iVar1;
  uint uVar2;
  esfm_chip *peVar3;
  esfm_chip *peVar4;
  byte bVar5;
  uint uVar6;
  byte local_39;
  uint8_t vibpos;
  int8_t range;
  esfm_channel *pair_primary;
  int pair_primary_idx;
  uint10 phase;
  uint23 noise;
  ushort local_1c;
  esbool n_bit;
  esbool rm_xor;
  uint32 basefreq;
  uint10 f_num;
  uint3 block;
  esfm_chip *chip;
  esfm_slot *slot_local;
  
  peVar3 = slot->chip;
  rm_xor = slot->channel->slots[0].block;
  local_1c = slot->channel->slots[0].f_num;
  iVar1 = emu_4op_secondary_to_primary[slot->channel->channel_idx];
  if ((-1 < iVar1) &&
     (peVar4 = slot->channel->chip, peVar4->channels[iVar1].emu_mode_4op_enable != '\0')) {
    rm_xor = peVar4->channels[iVar1].slots[0].block;
    local_1c = peVar4->channels[iVar1].slots[0].f_num;
  }
  if (slot->vibrato_en != '\0') {
    local_39 = (byte)((int)(uint)local_1c >> 7) & 7;
    bVar5 = peVar3->vibrato_pos;
    if ((bVar5 & 3) == 0) {
      local_39 = 0;
    }
    else if ((bVar5 & 1) != 0) {
      local_39 = (char)local_39 >> 1;
    }
    local_39 = (byte)((int)(char)local_39 >> ((peVar3->emu_vibrato_deep != '\0' ^ 0xffU) & 1));
    if ((bVar5 & 4) != 0) {
      local_39 = -local_39;
    }
    local_1c = local_1c + (short)(char)local_39;
  }
  uVar6 = (slot->in).phase_acc >> 9;
  if ((slot->in).phase_reset != '\0') {
    (slot->in).phase_acc = 0;
  }
  (slot->in).phase_acc =
       (((int)((uint)local_1c << (rm_xor & 0x1fU)) >> 1) *
        (uint)"\x01\x02\x04\x06\b\n\f\x0e\x10\x12\x14\x14\x18\x18\x1e\x1e"[slot->mult] >> 1) +
       (slot->in).phase_acc;
  (slot->in).phase_acc = (slot->in).phase_acc & 0x7ffff;
  (slot->in).phase_out = (uint10)uVar6;
  uVar2 = peVar3->lfsr;
  if ((slot->channel->channel_idx == '\a') && (slot->slot_idx == '\0')) {
    peVar3->rm_hh_bit2 = (byte)((int)(uVar6 & 0xffff) >> 2) & 1;
    peVar3->rm_hh_bit3 = (byte)((int)(uVar6 & 0xffff) >> 3) & 1;
    peVar3->rm_hh_bit7 = (byte)((int)(uVar6 & 0xffff) >> 7) & 1;
    peVar3->rm_hh_bit8 = (byte)(uVar6 >> 8) & 1;
  }
  if ((slot->channel->channel_idx == '\b') && (slot->slot_idx == '\x01')) {
    peVar3->rm_tc_bit3 = (byte)((int)(uVar6 & 0xffff) >> 3) & 1;
    peVar3->rm_tc_bit5 = (byte)((int)(uVar6 & 0xffff) >> 5) & 1;
  }
  if ((peVar3->emu_rhy_mode_flags & 0x20) != 0) {
    bVar5 = peVar3->rm_hh_bit2 ^ peVar3->rm_hh_bit7 | peVar3->rm_hh_bit3 ^ peVar3->rm_tc_bit5 |
            peVar3->rm_tc_bit3 ^ peVar3->rm_tc_bit5;
    if (slot->channel->channel_idx == '\a') {
      if (slot->slot_idx == '\0') {
        (slot->in).phase_out = (short)(char)bVar5 << 9;
        if ((int)(char)bVar5 == (uVar2 & 1)) {
          (slot->in).phase_out = (slot->in).phase_out | 0x34;
        }
        else {
          (slot->in).phase_out = (slot->in).phase_out | 0xd0;
        }
      }
      else if (slot->slot_idx == '\x01') {
        (slot->in).phase_out =
             (ushort)peVar3->rm_hh_bit8 << 9 | (ushort)(((uint)peVar3->rm_hh_bit8 ^ uVar2 & 1) << 8)
        ;
      }
    }
    else if ((slot->channel->channel_idx == '\b') && (slot->slot_idx == '\x01')) {
      (slot->in).phase_out = (short)(char)bVar5 << 9 | 0x80;
    }
  }
  peVar3->lfsr = uVar2 >> 1 | (int)(char)(((byte)(uVar2 >> 0xe) ^ (byte)uVar2) & 1) << 0x16;
  return;
}

Assistant:

static void
ESFM_phase_generate_emu(esfm_slot *slot)
{
	esfm_chip *chip;
	uint3 block;
	uint10 f_num;
	uint32 basefreq;
	esbool rm_xor, n_bit;
	uint23 noise;
	uint10 phase;
	int pair_primary_idx;

	chip = slot->chip;
	block = slot->channel->slots[0].block;
	f_num = slot->channel->slots[0].f_num;

	pair_primary_idx = emu_4op_secondary_to_primary[slot->channel->channel_idx];
	if (pair_primary_idx >= 0)
	{
		esfm_channel *pair_primary = &slot->channel->chip->channels[pair_primary_idx];
		if (pair_primary->emu_mode_4op_enable)
		{
			block = pair_primary->slots[0].block;
			f_num = pair_primary->slots[0].f_num;
		}
	}

	if (slot->vibrato_en)
	{
		int8_t range;
		uint8_t vibpos;

		range = (f_num >> 7) & 7;
		vibpos = chip->vibrato_pos;

		if (!(vibpos & 3))
		{
			range = 0;
		}
		else if (vibpos & 1)
		{
			range >>= 1;
		}
		range >>= !chip->emu_vibrato_deep;

		if (vibpos & 4)
		{
			range = -range;
		}
		f_num += range;
	}
	basefreq = (f_num << block) >> 1;
	phase = (uint10)(slot->in.phase_acc >> 9);
	if (slot->in.phase_reset)
	{
		slot->in.phase_acc = 0;
	}
	slot->in.phase_acc += (basefreq * mt[slot->mult]) >> 1;
	slot->in.phase_acc &= (1 << 19) - 1;
	slot->in.phase_out = phase;

	/* Noise mode (rhythm) sounds */
	noise = chip->lfsr;
	/* HH */
	if (slot->channel->channel_idx == 7 && slot->slot_idx == 0)
	{
		chip->rm_hh_bit2 = (phase >> 2) & 1;
		chip->rm_hh_bit3 = (phase >> 3) & 1;
		chip->rm_hh_bit7 = (phase >> 7) & 1;
		chip->rm_hh_bit8 = (phase >> 8) & 1;
	}
	/* TC */
	if (slot->channel->channel_idx == 8 && slot->slot_idx == 1)
	{
		chip->rm_tc_bit3 = (phase >> 3) & 1;
		chip->rm_tc_bit5 = (phase >> 5) & 1;
	}
	if (chip->emu_rhy_mode_flags & 0x20)
	{
		rm_xor = (chip->rm_hh_bit2 ^ chip->rm_hh_bit7)
			   | (chip->rm_hh_bit3 ^ chip->rm_tc_bit5)
			   | (chip->rm_tc_bit3 ^ chip->rm_tc_bit5);
		if (slot->channel->channel_idx == 7)
		{
			if (slot->slot_idx == 0) {
				/* HH */
				slot->in.phase_out = rm_xor << 9;
				if (rm_xor ^ (noise & 1))
				{
					slot->in.phase_out |= 0xd0;
				}
				else
				{
					slot->in.phase_out |= 0x34;
				}
			}
			else if (slot->slot_idx == 1)
			{
				/* SD */
				slot->in.phase_out = (chip->rm_hh_bit8 << 9)
					| ((chip->rm_hh_bit8 ^ (noise & 1)) << 8);
			}
		}
		else if (slot->channel->channel_idx == 8 && slot->slot_idx == 1)
		{
			/* TC */
			slot->in.phase_out = (rm_xor << 9) | 0x80;
		}
	}

	n_bit = ((noise >> 14) ^ noise) & 0x01;
	chip->lfsr = (noise >> 1) | (n_bit << 22);
}